

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O3

float Read<float>(IOStream *stream)

{
  int iVar1;
  undefined4 extraout_var;
  runtime_error *this;
  float t;
  float local_44;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  iVar1 = (*stream->_vptr_IOStream[2])(stream,&local_44,4,1);
  if (CONCAT44(extraout_var,iVar1) == 1) {
    return local_44;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Unexpected EOF","");
  std::runtime_error::runtime_error(this,(string *)local_40);
  *(undefined ***)this = &PTR__runtime_error_0080bf48;
  __cxa_throw(this,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T Read(IOStream * stream) {
    T t;
    size_t res = stream->Read( &t, sizeof(T), 1 );
    if(res != 1)
        throw DeadlyImportError("Unexpected EOF");
    return t;
}